

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O1

void linker_relrefs(GlobalVars *gv)

{
  byte *pbVar1;
  uint8_t *puVar2;
  char cVar3;
  byte bVar4;
  node *pnVar5;
  Reloc *reloc;
  unsigned_long uVar6;
  uint uVar7;
  node *pnVar8;
  node *pnVar9;
  Section *pSVar10;
  char *pcVar11;
  RelocInsert *pRVar12;
  Symbol *pSVar13;
  int entrytype;
  ulong uVar14;
  ulong uVar15;
  node *pnVar16;
  Section *sec;
  Symbol *local_50;
  Symbol *local_40;
  
  pnVar8 = (gv->selobjects).first;
  if (pnVar8->next != (node *)0x0) {
    local_40 = (Symbol *)0x0;
    local_50 = (Symbol *)0x0;
    pSVar13 = (Symbol *)0x0;
    do {
      for (sec = (Section *)pnVar8[2].next; (sec->n).next != (node *)0x0;
          sec = (Section *)(sec->n).next) {
        sec->relrefs = (RelRef *)0x0;
        for (pnVar16 = (sec->xrefs).first; pnVar16->next != (node *)0x0; pnVar16 = pnVar16->next) {
          pnVar9 = pnVar16[3].next;
          if (pnVar9 != (node *)0x0) {
            pnVar5 = pnVar16[2].next;
            uVar14 = sec->last_reloc;
            do {
              uVar15 = (long)&pnVar5->next +
                       (ulong)((uint)*(ushort *)&pnVar9->pred +
                               (uint)*(ushort *)((long)&pnVar9->pred + 2) + 7 >> 3);
              if (uVar14 < uVar15) {
                sec->last_reloc = uVar15;
                uVar14 = uVar15;
              }
              pnVar9 = pnVar9->next;
            } while (pnVar9 != (node *)0x0);
          }
          pnVar9 = pnVar16[1].pred;
          if (((pnVar9 != (node *)0x0) && (pnVar9[3].pred != (node *)0x0)) &&
             ((*(byte *)&pnVar9[4].next & 0xfe) == 2)) {
            if ((((ulong)*(byte *)&pnVar16[3].pred < 0x23) &&
                ((0x600000400U >> ((ulong)*(byte *)&pnVar16[3].pred & 0x3f) & 1) != 0)) &&
               (*(byte *)&pnVar9[4].next == 3)) {
              pSVar10 = scommon_section(gv,(ObjectUnit *)pnVar9[3].pred[1].next);
              pnVar9[3].pred = &pSVar10->n;
            }
            cVar3 = *(char *)&pnVar16[3].pred;
            if ((cVar3 == '\"') || (cVar3 == '\n')) {
              pnVar9 = pnVar9[3].pred;
              pbVar1 = (byte *)((long)&pnVar9[2].pred + 5);
              *pbVar1 = *pbVar1 | 4;
              if ((gv->textbaserel == 0) && (*(char *)((long)&pnVar9[2].pred + 4) == '\x01')) {
                pcVar11 = getobjname(sec->obj);
                error(0x79,pcVar11,sec->name,pnVar16[2].next);
              }
            }
            else if ((cVar3 == '\x02') && ((Section *)pnVar9[3].pred != sec)) {
              addrelref(&sec->relrefs,(Section *)pnVar9[3].pred);
            }
          }
        }
        reloc = (Reloc *)(sec->relocs).first;
        pnVar16 = (reloc->n).next;
        while (pnVar16 != (node *)0x0) {
          pRVar12 = reloc->insert;
          if (pRVar12 != (RelocInsert *)0x0) {
            uVar6 = reloc->offset;
            uVar14 = sec->last_reloc;
            do {
              uVar15 = ((uint)pRVar12->bpos + (uint)pRVar12->bsiz + 7 >> 3) + uVar6;
              if (uVar14 < uVar15) {
                sec->last_reloc = uVar15;
                uVar14 = uVar15;
              }
              pRVar12 = pRVar12->next;
            } while (pRVar12 != (RelocInsert *)0x0);
          }
          bVar4 = reloc->rtype;
          uVar7 = (uint)bVar4;
          switch(bVar4) {
          case 2:
            if ((reloc->relocsect).ptr == sec) {
              if (9 < bVar4) {
                if (bVar4 != 10) goto switchD_0010c3ee_default;
                goto switchD_0010c3ee_caseD_a;
              }
              if (bVar4 - 3 < 2) goto switchD_0010c3ee_caseD_3;
              if (uVar7 - 7 < 2) goto switchD_0010c3ee_caseD_7;
            }
            else {
              addrelref(&sec->relrefs,(reloc->relocsect).ptr);
            }
            break;
          case 3:
          case 4:
switchD_0010c3ee_caseD_3:
            entrytype = 4;
            goto LAB_0010c438;
          case 5:
          case 6:
          case 9:
            break;
          case 7:
          case 8:
switchD_0010c3ee_caseD_7:
            entrytype = 5;
LAB_0010c438:
            dyn_reloc_entry(gv,reloc,entrytype);
            break;
          case 10:
switchD_0010c3ee_caseD_a:
            puVar2 = &((reloc->relocsect).ptr)->flags;
            *puVar2 = *puVar2 | 4;
            if (pSVar13 == (Symbol *)0x0) {
              pSVar13 = find_any_symbol(gv,sec,"_SDA_BASE_");
              if (pSVar13 == (Symbol *)0x0) {
                pSVar13 = (Symbol *)0x0;
              }
              else {
                pSVar13->flags = pSVar13->flags | 2;
              }
            }
LAB_0010c4e8:
            if ((gv->textbaserel == 0) && (((reloc->relocsect).ptr)->type == '\x01')) {
              pcVar11 = getobjname(sec->obj);
              error(0x79,pcVar11,sec->name,reloc->offset);
            }
            break;
          default:
switchD_0010c3ee_default:
            if (uVar7 == 0x20) {
              if (local_50 == (Symbol *)0x0) {
                local_50 = find_any_symbol(gv,sec,"_SDA2_BASE_");
                if (local_50 == (Symbol *)0x0) {
                  local_50 = (Symbol *)0x0;
                }
                else {
                  local_50->flags = local_50->flags | 2;
                }
              }
            }
            else if (uVar7 == 0x22) {
              puVar2 = &((reloc->relocsect).ptr)->flags;
              *puVar2 = *puVar2 | 4;
              if (local_40 == (Symbol *)0x0) {
                local_40 = find_any_symbol(gv,sec,"__r13_init");
                if (local_40 == (Symbol *)0x0) {
                  local_40 = (Symbol *)0x0;
                }
                else {
                  local_40->flags = local_40->flags | 2;
                }
              }
              goto LAB_0010c4e8;
            }
          }
          reloc = (Reloc *)(reloc->n).next;
          pnVar16 = (reloc->n).next;
        }
      }
      pnVar8 = pnVar8->next;
    } while (pnVar8->next != (node *)0x0);
  }
  return;
}

Assistant:

void linker_relrefs(struct GlobalVars *gv)
/* All relocations and unresolved xrefs with a relative reference
   to other sections are collected. A second task is to detect
   and handle base-relative and GOT/PLT references. */
{
  struct ObjectUnit *obj;
  struct Section *sec;
  struct Symbol *sdabase = NULL;
  struct Symbol *sda2base = NULL;
  struct Symbol *r13init = NULL;

  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

    for (sec=(struct Section *)obj->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      struct RelRef **rr = &sec->relrefs;
      struct Symbol *xdef;
      struct Reloc *xref,*reloc;

      for (*rr=NULL,xref=(struct Reloc *)sec->xrefs.first;
           xref->n.next!=NULL; xref=(struct Reloc *)xref->n.next) {

        /* remember offset of sections's last xref */
        set_last_sec_reloc(sec,xref);

        if (xdef = xref->relocsect.symbol) {
          if (xdef->relsect!=NULL &&
              (xdef->type==SYM_RELOC || xdef->type==SYM_COMMON)) {

            if ((xref->rtype==R_SD || xref->rtype==R_SD21 ||
                 xref->rtype==R_MOSDREL) && xdef->type==SYM_COMMON) {
                /* small data common symbol - assign .scommon section */
                xdef->relsect = scommon_section(gv,xdef->relsect->obj);
            }

            if (xref->rtype==R_PC && xdef->relsect!=sec) {
              /* relative reference to different section */
              addrelref(rr,xdef->relsect);
            }

            else if (xref->rtype==R_SD || xref->rtype==R_MOSDREL) {
              /* other section is accessed base relative from this one */
              xdef->relsect->flags |= SF_SMALLDATA;
              if (!gv->textbaserel && xdef->relsect->type==ST_CODE)
                error(121,getobjname(sec->obj),sec->name,xref->offset);
            }
          }
        }
      }

      for (reloc=(struct Reloc *)sec->relocs.first;
           reloc->n.next!=NULL; reloc=(struct Reloc *)reloc->n.next) {

        /* remember offset of sections's last reloc */
        set_last_sec_reloc(sec,reloc);

        if (reloc->rtype==R_PC && reloc->relocsect.ptr!=sec) {
          /* relative reference to different section */
          addrelref(rr,reloc->relocsect.ptr);
        }

        else if (reloc->rtype==R_GOT || reloc->rtype==R_GOTPC) {
          /* a local relocation to a GOT entry may create that entry */
          dyn_reloc_entry(gv,reloc,GOT_LOCAL);
        }

        else if (reloc->rtype==R_PLT || reloc->rtype==R_PLTPC) {
          /* a local relocation to a PLT entry may create that entry */
          dyn_reloc_entry(gv,reloc,PLT_LOCAL);
        }

        else if (reloc->rtype == R_SD) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!sdabase) {
            /* R_SD relocation implies a reference to _SDA_BASE_ */
            if (sdabase = find_any_symbol(gv,sec,sdabase_name))
              sdabase->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

        else if (reloc->rtype == R_SD2) {
          if (!sda2base) {
            /* R_SD2 relocation implies a reference to _SDA2_BASE_ */
            if (sda2base = find_any_symbol(gv,sec,sda2base_name))
              sda2base->flags |= SYMF_REFERENCED;
          }
        }

        else if (reloc->rtype == R_MOSDREL) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!r13init) {
            /* R_MOSDREL relocation implies a reference to __r13_init */
            if (r13init = find_any_symbol(gv,sec,r13init_name))
              r13init->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

      }
    }
  }
}